

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dagify.cpp
# Opt level: O2

void __thiscall handlegraph::algorithms::SubHandleGraph::follow_edges_impl(SubHandleGraph *this)

{
  function<bool_(const_handlegraph::handle_t_&)> *in_RCX;
  bool in_DL;
  handle_t *in_RSI;
  
  follow_edges_impl((SubHandleGraph *)
                    (&(this->super_ExpandingOverlayGraph).field_0x0 +
                    *(long *)((long)this->super_ExpandingOverlayGraph + -0xa0)),in_RSI,in_DL,in_RCX)
  ;
  return;
}

Assistant:

bool SubHandleGraph::follow_edges_impl(const handle_t& handle, bool go_left, const function<bool(const handle_t&)>& iteratee) const {
    // only let it travel along edges whose endpoints are in the subgraph
    bool keep_going = true;
    super->follow_edges(handle, go_left, [&](const handle_t& handle) {
        if (contents.count(super->get_id(handle))) {
            keep_going = iteratee(handle);
        }
        return keep_going;
    });
    return keep_going;
}